

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::MapFieldBase::SpaceUsedExcludingSelfLong(MapFieldBase *this)

{
  MutexLock local_28;
  MutexLock lock;
  ReflectionPayload *p;
  size_t size;
  MapFieldBase *this_local;
  
  ConstAccess(this);
  p = (ReflectionPayload *)0x0;
  lock.mu_ = (Mutex *)maybe_payload(this);
  if ((ReflectionPayload *)lock.mu_ != (ReflectionPayload *)0x0) {
    absl::lts_20240722::MutexLock::MutexLock(&local_28,&((ReflectionPayload *)lock.mu_)->mutex);
    p = (ReflectionPayload *)SpaceUsedExcludingSelfNoLock(this);
    absl::lts_20240722::MutexLock::~MutexLock(&local_28);
    ConstAccess(this);
  }
  return (size_t)p;
}

Assistant:

size_t MapFieldBase::SpaceUsedExcludingSelfLong() const {
  ConstAccess();
  size_t size = 0;
  if (auto* p = maybe_payload()) {
    {
      absl::MutexLock lock(&p->mutex);
      size = SpaceUsedExcludingSelfNoLock();
    }
    ConstAccess();
  }
  return size;
}